

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

uint32_t spvtools::opt::anon_unknown_0::GetNumberOfMembers(Type *type,IRContext *context)

{
  int iVar1;
  uint32_t id;
  undefined4 extraout_var;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *this;
  size_type sVar2;
  undefined4 extraout_var_00;
  ConstantManager *this_00;
  Constant *this_01;
  Type *pTVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Matrix *matrix_type;
  Vector *vector_type;
  Constant *length_const;
  Array *array_type;
  Struct *struct_type;
  IRContext *context_local;
  Type *type_local;
  
  iVar1 = (*type->_vptr_Type[0x1e])();
  if ((Struct *)CONCAT44(extraout_var,iVar1) == (Struct *)0x0) {
    iVar1 = (*type->_vptr_Type[0x18])();
    if ((Array *)CONCAT44(extraout_var_00,iVar1) == (Array *)0x0) {
      iVar1 = (*type->_vptr_Type[0xe])();
      if ((Vector *)CONCAT44(extraout_var_02,iVar1) == (Vector *)0x0) {
        iVar1 = (*type->_vptr_Type[0x10])();
        if ((Matrix *)CONCAT44(extraout_var_03,iVar1) == (Matrix *)0x0) {
          type_local._4_4_ = 0;
        }
        else {
          type_local._4_4_ =
               analysis::Matrix::element_count((Matrix *)CONCAT44(extraout_var_03,iVar1));
        }
      }
      else {
        type_local._4_4_ =
             analysis::Vector::element_count((Vector *)CONCAT44(extraout_var_02,iVar1));
      }
    }
    else {
      this_00 = IRContext::get_constant_mgr(context);
      id = analysis::Array::LengthId((Array *)CONCAT44(extraout_var_00,iVar1));
      this_01 = analysis::ConstantManager::FindDeclaredConstant(this_00,id);
      if (this_01 == (Constant *)0x0) {
        type_local._4_4_ = 0;
      }
      else {
        pTVar3 = analysis::Constant::type(this_01);
        iVar1 = (*pTVar3->_vptr_Type[10])();
        if (CONCAT44(extraout_var_01,iVar1) == 0) {
          __assert_fail("length_const->type()->AsInteger()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                        ,0x38,
                        "uint32_t spvtools::opt::(anonymous namespace)::GetNumberOfMembers(const analysis::Type *, IRContext *)"
                       );
        }
        type_local._4_4_ = analysis::Constant::GetU32(this_01);
      }
    }
  }
  else {
    this = analysis::Struct::element_types((Struct *)CONCAT44(extraout_var,iVar1));
    sVar2 = std::
            vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            ::size(this);
    type_local._4_4_ = (uint32_t)sVar2;
  }
  return type_local._4_4_;
}

Assistant:

uint32_t GetNumberOfMembers(const analysis::Type* type, IRContext* context) {
  if (const analysis::Struct* struct_type = type->AsStruct()) {
    return static_cast<uint32_t>(struct_type->element_types().size());
  } else if (const analysis::Array* array_type = type->AsArray()) {
    const analysis::Constant* length_const =
        context->get_constant_mgr()->FindDeclaredConstant(
            array_type->LengthId());

    if (length_const == nullptr) {
      // This can happen if the length is an OpSpecConstant.
      return 0;
    }
    assert(length_const->type()->AsInteger());
    return length_const->GetU32();
  } else if (const analysis::Vector* vector_type = type->AsVector()) {
    return vector_type->element_count();
  } else if (const analysis::Matrix* matrix_type = type->AsMatrix()) {
    return matrix_type->element_count();
  } else {
    return 0;
  }
}